

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ExceptionTranslatorRegistry::registerTranslator
          (ExceptionTranslatorRegistry *this,unique_ptr<Catch::IExceptionTranslator> *translator)

{
  unique_ptr<const_Catch::IExceptionTranslator> local_20;
  unique_ptr<Catch::IExceptionTranslator> *local_18;
  unique_ptr<Catch::IExceptionTranslator> *translator_local;
  ExceptionTranslatorRegistry *this_local;
  
  local_18 = translator;
  translator_local = (unique_ptr<Catch::IExceptionTranslator> *)this;
  Detail::unique_ptr<Catch::IExceptionTranslator_const>::
  unique_ptr<Catch::IExceptionTranslator,void>
            ((unique_ptr<Catch::IExceptionTranslator_const> *)&local_20,translator);
  std::
  vector<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
  ::push_back(&this->m_translators,(value_type *)&local_20);
  Detail::unique_ptr<const_Catch::IExceptionTranslator>::~unique_ptr(&local_20);
  return;
}

Assistant:

void ExceptionTranslatorRegistry::registerTranslator( Detail::unique_ptr<IExceptionTranslator>&& translator ) {
        m_translators.push_back( CATCH_MOVE( translator ) );
    }